

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_disarm_test(player *p,loc grid)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = square_isknown(cave,(loc)p);
  if (_Var1) {
    _Var1 = square_iscloseddoor(cave,(loc)p);
    if ((_Var1) && (_Var1 = square_islockeddoor(cave,(loc)p), !_Var1)) {
      return true;
    }
    _Var1 = square_isdisarmabletrap(cave,(loc)p);
    if (_Var1) {
      return true;
    }
    _Var1 = square_ismonstertrap(cave,(loc)p);
    if (_Var1) {
      return true;
    }
    _Var1 = square_iswarded(cave,(loc)p);
    if (_Var1) {
      return true;
    }
    _Var1 = square_isdecoyed(cave,(loc)p);
    if (_Var1) {
      return true;
    }
    fmt = "You see nothing there to disarm.";
  }
  else {
    fmt = "You see nothing there.";
  }
  msg(fmt);
  return false;
}

Assistant:

static bool do_cmd_disarm_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Look for a closed, unlocked door to lock */
	if (square_iscloseddoor(cave, grid) && !square_islockeddoor(cave, grid))
		return true;

	/* Look for a trap */
	if (square_isdisarmabletrap(cave, grid)) {
		return true;
	}
	if (square_ismonstertrap(cave, grid)) {
		return true;
	}
	if (square_iswarded(cave, grid)) {
		return true;
	}
	if (square_isdecoyed(cave, grid)) {
		return true;
	}

	/* Nothing */
	msg("You see nothing there to disarm.");
	return false;
}